

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_transaction.cpp
# Opt level: O2

string * __thiscall
cfd::api::json::TransactionJsonApi::ConvertLockingScriptTypeString_abi_cxx11_
          (string *__return_storage_ptr__,TransactionJsonApi *this,LockingScriptType script_type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "nonstandard";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "pubkey";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "pubkeyhash";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "scripthash";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "multisig";
    paVar1 = &local_d;
    break;
  case 5:
    pcVar2 = "nulldata";
    paVar1 = &local_e;
    break;
  case 6:
    pcVar2 = "witness_v0_scripthash";
    paVar1 = &local_f;
    break;
  case 7:
    pcVar2 = "witness_v0_keyhash";
    paVar1 = &local_10;
    break;
  case 8:
    pcVar2 = "witness_v1_taproot";
    paVar1 = &local_11;
    break;
  case 9:
    pcVar2 = "witness_unknown";
    paVar1 = &local_12;
    break;
  case 10:
    pcVar2 = "true";
    paVar1 = &local_13;
    break;
  case 0xb:
    pcVar2 = "fee";
    paVar1 = &local_14;
    break;
  default:
    pcVar2 = "";
    paVar1 = &local_15;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string TransactionJsonApi::ConvertLockingScriptTypeString(
    LockingScriptType script_type) {
  switch (script_type) {
    case LockingScriptType::kNonStandard:
      return "nonstandard";
    case LockingScriptType::kPayToPubkey:
      return "pubkey";
    case LockingScriptType::kPayToPubkeyHash:
      return "pubkeyhash";
    case LockingScriptType::kPayToScriptHash:
      return "scripthash";
    case LockingScriptType::kMultisig:
      return "multisig";
    case LockingScriptType::kNullData:
      return "nulldata";
    case LockingScriptType::kWitnessV0ScriptHash:
      return "witness_v0_scripthash";
    case LockingScriptType::kWitnessV0KeyHash:
      return "witness_v0_keyhash";
    case LockingScriptType::kWitnessV1Taproot:
      return "witness_v1_taproot";
    case LockingScriptType::kWitnessUnknown:
      return "witness_unknown";
    case LockingScriptType::kTrue:
      return "true";
#ifndef CFD_DISABLE_ELEMENTS
    case LockingScriptType::kFee:
      return "fee";
#endif  // CFD_DISABLE_ELEMENTS
    default:
      break;
  }
  return "";
}